

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<1>>
             *this,char **it)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  bool bVar4;
  long lVar5;
  byte *pbVar6;
  uint uVar7;
  size_t __len;
  char *pcVar8;
  char *__s;
  
  lVar2 = *(long *)(this + 0x10);
  __s = *it;
  if (lVar2 != 0) {
    lVar3 = *(long *)(this + 8);
    lVar5 = 0;
    do {
      __s[lVar5] = *(char *)(lVar3 + lVar5);
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
    __s = __s + lVar5;
    *it = __s;
  }
  __n = *(size_t *)(this + 0x20);
  pcVar8 = __s;
  if (__n != 0) {
    pcVar8 = __s + __n;
    switchD_01043a80::default(__s,*(int *)(this + 0x18),__n);
  }
  iVar1 = *(int *)(this + 0x2c);
  pbVar6 = (byte *)(__s + __n + (long)iVar1);
  uVar7 = *(uint *)(this + 0x28);
  do {
    pbVar6 = pbVar6 + -1;
    *pbVar6 = (byte)uVar7 & 1 | 0x30;
    bVar4 = 1 < uVar7;
    uVar7 = uVar7 >> 1;
  } while (bVar4);
  *it = pcVar8 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }